

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall front::irGenerator::irGenerator::ir_label(irGenerator *this,LabelId label)

{
  JumpLabelId *this_00;
  LabelId in_ESI;
  shared_ptr<front::irGenerator::JumpLabelId> jumpLabelId;
  shared_ptr<front::irGenerator::JumpLabelId> *in_stack_ffffffffffffff78;
  value_type *__x;
  shared_ptr<front::irGenerator::JumpLabelId> *in_stack_ffffffffffffff80;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *this_01;
  key_type *in_stack_ffffffffffffffb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  local_30;
  LabelId local_c;
  
  local_c = in_ESI;
  std::shared_ptr<front::irGenerator::JumpLabelId>::shared_ptr
            ((shared_ptr<front::irGenerator::JumpLabelId> *)0x26110a);
  this_00 = (JumpLabelId *)operator_new(4);
  JumpLabelId::JumpLabelId(this_00,local_c);
  std::shared_ptr<front::irGenerator::JumpLabelId>::shared_ptr<front::irGenerator::JumpLabelId,void>
            (in_stack_ffffffffffffff80,(JumpLabelId *)in_stack_ffffffffffffff78);
  this_01 = &local_30;
  std::shared_ptr<front::irGenerator::JumpLabelId>::operator=
            ((shared_ptr<front::irGenerator::JumpLabelId> *)this_01,in_stack_ffffffffffffff78);
  std::shared_ptr<front::irGenerator::JumpLabelId>::~shared_ptr
            ((shared_ptr<front::irGenerator::JumpLabelId> *)0x26115a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __x = (value_type *)&stack0xffffffffffffffa8;
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::
  variant<std::shared_ptr<front::irGenerator::JumpLabelId>&,void,void,std::shared_ptr<front::irGenerator::JumpLabelId>,void>
            (this_01,(shared_ptr<front::irGenerator::JumpLabelId> *)__x);
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  ::push_back((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               *)this_01,__x);
  std::
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)0x2611b8);
  std::shared_ptr<front::irGenerator::JumpLabelId>::~shared_ptr
            ((shared_ptr<front::irGenerator::JumpLabelId> *)0x2611c2);
  return;
}

Assistant:

void irGenerator::ir_label(LabelId label) {
  shared_ptr<JumpLabelId> jumpLabelId;

  jumpLabelId = shared_ptr<JumpLabelId>(new JumpLabelId(label));

  _funcNameToInstructions[_funcStack.back()].push_back(jumpLabelId);
}